

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraffic.h
# Opt level: O0

string * strAtMost(string *s,size_t m)

{
  ulong uVar1;
  ulong in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *__rhs;
  string local_38 [32];
  ulong local_18;
  
  local_18 = in_RDX;
  uVar1 = std::__cxx11::string::length();
  if (local_18 < uVar1) {
    __rhs = local_38;
    std::__cxx11::string::substr((ulong)__rhs,(ulong)in_RSI);
    std::operator+(in_RSI,(char *)__rhs);
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)in_RSI);
  }
  return in_RDI;
}

Assistant:

inline std::string strAtMost(const std::string s, size_t m) {
    return s.length() <= m ? s :
    s.substr(0, m-3) + "...";
}